

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timing.c
# Opt level: O0

int mbedtls_timing_get_delay(void *data)

{
  unsigned_long uVar1;
  unsigned_long elapsed_ms;
  mbedtls_timing_delay_context *ctx;
  void *data_local;
  
  if (*(int *)((long)data + 0x24) == 0) {
    data_local._4_4_ = -1;
  }
  else {
    uVar1 = mbedtls_timing_get_timer((mbedtls_timing_hr_time *)data,0);
    if (uVar1 < *(uint *)((long)data + 0x24)) {
      if (uVar1 < *(uint *)((long)data + 0x20)) {
        data_local._4_4_ = 0;
      }
      else {
        data_local._4_4_ = 1;
      }
    }
    else {
      data_local._4_4_ = 2;
    }
  }
  return data_local._4_4_;
}

Assistant:

int mbedtls_timing_get_delay( void *data )
{
    mbedtls_timing_delay_context *ctx = (mbedtls_timing_delay_context *) data;
    unsigned long elapsed_ms;

    if( ctx->fin_ms == 0 )
        return( -1 );

    elapsed_ms = mbedtls_timing_get_timer( &ctx->timer, 0 );

    if( elapsed_ms >= ctx->fin_ms )
        return( 2 );

    if( elapsed_ms >= ctx->int_ms )
        return( 1 );

    return( 0 );
}